

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O2

double inform_shannon_multi_pmi
                 (inform_dist *joint,inform_dist **marginals,size_t n,size_t joint_event,
                 size_t *marginal_events,double base)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = 0.0;
  if (1 < n) {
    dVar3 = inform_shannon_si(joint,joint_event,base);
    dVar3 = -dVar3;
    for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
      dVar2 = inform_shannon_si(marginals[sVar1],marginal_events[sVar1],base);
      dVar3 = dVar3 + dVar2;
    }
  }
  return dVar3;
}

Assistant:

double inform_shannon_multi_pmi(inform_dist const *joint,
    inform_dist const **marginals, size_t n, size_t joint_event,
    size_t const *marginal_events, double base)
{
    if (n < 2)
    {
        return 0.0;
    }
    double pmi = -inform_shannon_si(joint, joint_event, base);
    for (size_t i = 0; i < n; ++i)
    {
        pmi += inform_shannon_si(marginals[i], marginal_events[i], base);
    }
    return pmi;
}